

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O1

void Exa_ManExactSynthesis2(Bmc_EsPar_t *pPars)

{
  ulong *puVar1;
  word wVar2;
  lit *begin;
  undefined8 *puVar3;
  Bmc_EsPar_t *pBVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined8 *__ptr;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar8;
  int *piVar9;
  void *pvVar10;
  sat_solver *s;
  uint uVar11;
  undefined8 *puVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  long *end;
  int iVar16;
  timespec *begin_00;
  undefined8 *puVar17;
  undefined8 *puVar18;
  char *pcVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  bool bVar30;
  byte bVar31;
  char cVar32;
  int iMint;
  timespec ts;
  word pTruth [16];
  long local_1d0;
  uint local_1c4;
  undefined8 *local_1c0;
  ulong local_1b8;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  undefined8 *local_1a0;
  undefined8 *local_198;
  int local_18c;
  undefined8 *local_188;
  ulong local_180;
  Bmc_EsPar_t *local_178;
  undefined8 *local_170;
  int local_164;
  ulong local_160;
  timespec local_158 [8];
  long local_d8;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8 [17];
  
  local_1c4 = 1;
  local_178 = pPars;
  iVar5 = clock_gettime(3,local_158);
  pBVar4 = local_178;
  if (iVar5 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec)),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) +
             CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec) * -1000000;
  }
  Abc_TtReadHex(local_b8,local_178->pTtStr);
  iVar5 = pBVar4->nVars;
  uVar23 = (ulong)iVar5;
  if (10 < (long)uVar23) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                  ,0x35a,"void Exa_ManExactSynthesis2(Bmc_EsPar_t *)");
  }
  __ptr = (undefined8 *)calloc(1,0x20c0);
  *__ptr = pBVar4;
  *(int *)(__ptr + 1) = iVar5;
  iVar22 = pBVar4->nNodes;
  *(int *)((long)__ptr + 0xc) = iVar22;
  iVar16 = iVar22 + iVar5;
  *(int *)(__ptr + 2) = iVar16;
  iVar14 = 1 << ((char)iVar5 - 6U & 0x1f);
  if (iVar5 < 7) {
    iVar14 = 1;
  }
  *(int *)((long)__ptr + 0x14) = iVar14;
  __ptr[4] = local_b8;
  p = (Vec_Wec_t *)malloc(0x10);
  iVar14 = 8;
  if (6 < (iVar22 + iVar5) - 1U) {
    iVar14 = iVar16;
  }
  p->nSize = 0;
  p->nCap = iVar14;
  if (iVar14 == 0) {
    pVVar8 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar8 = (Vec_Int_t *)calloc((long)iVar14,0x10);
  }
  p->pArray = pVVar8;
  p->nSize = iVar16;
  __ptr[0x416] = p;
  local_c8 = lVar15;
  if (0x20 < iVar16) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                  ,0x22e,"int Exa_ManMarkup(Exa_Man_t *)");
  }
  *(int *)(__ptr + 3) = iVar22 * 3 + 1;
  if (0 < iVar22) {
    local_198 = __ptr + 6;
    puVar12 = __ptr + uVar23 * 0x20 + 6;
    do {
      local_1c0 = local_198 + uVar23 * 0x20;
      puVar18 = puVar12;
      lVar15 = 0;
      local_1b8 = uVar23;
      do {
        if (local_178->fFewerVars == 0) {
LAB_005a0445:
          lVar29 = local_1b8 - lVar15;
          lVar28 = 0;
          if (local_178->fFewerVars != 0) {
            lVar28 = 1 - lVar15;
          }
          for (; lVar28 < lVar29; lVar28 = lVar28 + 1) {
            iVar5 = *(int *)(__ptr + 3);
            if (iVar5 < 0) goto LAB_005a167c;
            Vec_WecPush(p,(int)lVar28,iVar5 * 2);
            *(int *)(__ptr + 3) = iVar5 + 1;
            *(int *)((long)puVar18 + lVar28 * 4) = iVar5;
          }
        }
        else {
          iVar5 = *(int *)(__ptr + 2);
          if (lVar15 != 0 || iVar5 + -1 != (int)local_1b8) goto LAB_005a0445;
          iVar22 = *(int *)(__ptr + 3);
          if (iVar22 < 0) goto LAB_005a167c;
          Vec_WecPush(p,iVar5 + -2,iVar22 * 2);
          *(int *)(__ptr + 3) = iVar22 + 1;
          *(int *)((long)local_1c0 + (long)iVar5 * 4 + -8) = iVar22;
        }
        puVar18 = puVar18 + 0x10;
        bVar30 = lVar15 == 0;
        lVar15 = lVar15 + 1;
      } while (bVar30);
      uVar23 = local_1b8 + 1;
      puVar12 = puVar12 + 0x20;
    } while ((long)uVar23 < (long)*(int *)(__ptr + 2));
  }
  iVar5 = *(int *)(__ptr + 3);
  pvVar10 = (void *)0x0;
  printf("The number of parameter variables = %d.\n");
  lVar28 = (long)*(int *)((long)__ptr + 0x14);
  lVar15 = ((long)*(int *)(__ptr + 2) + 1) * lVar28;
  piVar9 = (int *)malloc(0x10);
  iVar22 = (int)lVar15;
  iVar14 = 0x10;
  if (0xe < iVar22 - 1U) {
    iVar14 = iVar22;
  }
  piVar9[1] = 0;
  *piVar9 = iVar14;
  if (iVar14 != 0) {
    pvVar10 = malloc((long)iVar14 << 3);
  }
  *(void **)(piVar9 + 2) = pvVar10;
  piVar9[1] = iVar22;
  memset(pvVar10,0,lVar15 * 8);
  __ptr[5] = piVar9;
  iVar22 = *(int *)(__ptr + 1);
  if (0 < (long)iVar22) {
    uVar6 = 1 << ((char)iVar22 - 6U & 0x1f);
    if (iVar22 < 7) {
      uVar6 = 1;
    }
    uVar23 = 0;
    do {
      if (((long)(uVar23 * lVar28) < 0) || (lVar15 <= (long)(uVar23 * lVar28))) goto LAB_005a16ba;
      if (uVar23 < 6) {
        if (0 < (int)uVar6) {
          wVar2 = s_Truths6[uVar23];
          uVar20 = 0;
          do {
            *(word *)((long)pvVar10 + uVar20 * 8) = wVar2;
            uVar20 = uVar20 + 1;
          } while (uVar6 != uVar20);
        }
      }
      else if (0 < (int)uVar6) {
        uVar20 = 0;
        do {
          *(ulong *)((long)pvVar10 + uVar20 * 8) =
               -(ulong)((1 << ((char)uVar23 - 6U & 0x1f) & (uint)uVar20) != 0);
          uVar20 = uVar20 + 1;
        } while (uVar6 != uVar20);
      }
      uVar23 = uVar23 + 1;
      pvVar10 = (void *)((long)pvVar10 + lVar28 * 8);
    } while (uVar23 != (long)iVar22);
  }
  __ptr[5] = piVar9;
  s = sat_solver_new();
  __ptr[0x417] = s;
  sat_solver_setnvars(s,iVar5);
  local_c0 = local_b8[0];
  if (((local_b8[0] & 1) != 0) && (iVar5 = *(int *)((long)__ptr + 0x14), 0 < (long)iVar5)) {
    lVar15 = 0;
    do {
      local_b8[lVar15] = ~local_b8[lVar15];
      lVar15 = lVar15 + 1;
    } while (iVar5 != lVar15);
  }
  puVar12 = (undefined8 *)(long)*(int *)(__ptr + 1);
  if (*(int *)(__ptr + 1) < *(int *)(__ptr + 2)) {
    local_1ac = local_178->fOnlyAnd;
    local_188 = __ptr + 6;
    puVar18 = __ptr + (long)puVar12 * 0x20 + 6;
    local_1a0 = __ptr + (long)puVar12 * 0x20 + 0x16;
LAB_005a0699:
    puVar3 = local_188;
    local_180 = (ulong)(uint)((int)puVar12 - *(int *)(__ptr + 1));
    puVar25 = (undefined8 *)0x0;
    local_198 = puVar12;
    local_170 = puVar18;
LAB_005a06c1:
    begin_00 = local_158;
    iVar5 = *(int *)(__ptr + 2);
    if ((long)iVar5 < 1) {
      uVar6 = 0;
    }
    else {
      lVar15 = 0;
      uVar6 = 0;
      do {
        iVar22 = *(int *)((long)puVar18 + lVar15 * 4);
        if (iVar22 != 0) {
          if (iVar22 < 0) goto LAB_005a167c;
          lVar28 = (long)(int)uVar6;
          uVar6 = uVar6 + 1;
          *(int *)((long)&local_158[0].tv_sec + lVar28 * 4) = iVar22 * 2;
        }
        lVar15 = lVar15 + 1;
      } while (iVar5 != lVar15);
    }
    if ((int)uVar6 < 1) {
      __assert_fail("nLits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                    ,0x2dd,"int Exa_ManAddCnfStart(Exa_Man_t *, int)");
    }
    uVar23 = (ulong)uVar6;
    iVar5 = sat_solver_addclause
                      ((sat_solver *)__ptr[0x417],(lit *)begin_00,
                       (lit *)((long)&local_158[0].tv_sec + uVar23 * 4));
    iVar22 = 1;
    if (iVar5 == 0) {
      bVar30 = false;
    }
    else {
      uVar20 = 0;
      local_1c0 = puVar25;
      local_1b8 = uVar23;
      do {
        uVar24 = uVar20 + 1;
        if (uVar24 < local_1b8) {
          uVar26 = 1;
          do {
            uVar6 = *(uint *)((long)&local_158[0].tv_sec + uVar20 * 4);
            if ((int)uVar6 < 0) {
LAB_005a169b:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            local_1a8 = uVar6 ^ 1;
            uVar6 = *(uint *)((long)&begin_00->tv_sec + uVar26 * 4);
            if ((int)uVar6 < 0) goto LAB_005a169b;
            local_1a4 = uVar6 ^ 1;
            iVar5 = sat_solver_addclause
                              ((sat_solver *)__ptr[0x417],(lit *)&local_1a8,(lit *)&local_1a0);
            puVar25 = local_1c0;
            if (iVar5 == 0) goto LAB_005a07e5;
            uVar26 = uVar26 + 1;
          } while (uVar23 != uVar26);
        }
        puVar25 = local_1c0;
        uVar23 = uVar23 - 1;
        begin_00 = (timespec *)((long)&begin_00->tv_sec + 4);
        uVar20 = uVar24;
      } while (uVar24 != local_1b8);
      bVar30 = false;
      if (local_1c0 == (undefined8 *)0x1) {
        iVar22 = 5;
      }
      else {
        bVar30 = true;
        if (*(int *)(__ptr + 2) < 1) {
          iVar22 = 0;
        }
        else {
          lVar15 = 0;
          puVar17 = local_1a0;
          do {
            if ((*(int *)((long)puVar3 + lVar15 * 4 + (long)puVar12 * 0x100) != 0) &&
               (lVar15 < *(int *)(__ptr + 2))) {
              lVar28 = 0;
              do {
                iVar5 = *(int *)((long)puVar17 + lVar28 * 4);
                if (iVar5 != 0) {
                  iVar22 = *(int *)((long)puVar3 + lVar15 * 4 + (long)puVar12 * 0x100);
                  if ((iVar22 < 0) || (local_1a8 = iVar22 * 2 + 1, iVar5 < 0)) goto LAB_005a167c;
                  local_1a4 = iVar5 * 2 + 1;
                  iVar5 = sat_solver_addclause
                                    ((sat_solver *)__ptr[0x417],(lit *)&local_1a8,(lit *)&local_1a0)
                  ;
                  if (iVar5 == 0) goto LAB_005a07e5;
                }
                lVar28 = lVar28 + 1;
              } while ((int)lVar28 + (int)lVar15 < *(int *)(__ptr + 2));
            }
            lVar15 = lVar15 + 1;
            puVar17 = (undefined8 *)((long)puVar17 + 4);
          } while (lVar15 < *(int *)(__ptr + 2));
          iVar22 = 0;
          bVar30 = true;
        }
      }
    }
    goto LAB_005a07f3;
  }
LAB_005a09e5:
  if (1 < *(int *)(__ptr + 2)) {
    lVar15 = 8;
    lVar28 = 0;
    do {
      if (*(int *)(__ptr[0x416] + 4) <= lVar28) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      lVar29 = *(long *)(__ptr[0x416] + 8);
      lVar13 = (long)*(int *)(lVar29 + -4 + lVar15);
      if (lVar13 < 1) {
        __assert_fail("Vec_IntSize(vArray) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                      ,0x317,"int Exa_ManAddCnfStart(Exa_Man_t *, int)");
      }
      begin = *(lit **)(lVar29 + lVar15);
      iVar5 = sat_solver_addclause((sat_solver *)__ptr[0x417],begin,begin + lVar13);
      if (iVar5 == 0) {
LAB_005a16f8:
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                      ,0x35e,"void Exa_ManExactSynthesis2(Bmc_EsPar_t *)");
      }
      lVar28 = lVar28 + 1;
      lVar15 = lVar15 + 0x10;
    } while (lVar28 < (long)*(int *)(__ptr + 2) + -1);
  }
  printf("Running exact synthesis for %d-input function with %d two-input gates...\n",
         (ulong)*(uint *)(__ptr + 1),(ulong)*(uint *)((long)__ptr + 0xc));
  if (local_1c4 != 0xffffffff) {
    local_198 = __ptr + 6;
    local_188 = (undefined8 *)((ulong)local_188 & 0xffffffff00000000);
    do {
      iVar5 = clock_gettime(3,local_158);
      if (iVar5 < 0) {
        lVar15 = 1;
      }
      else {
        lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                        SEXT816(CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec)),8);
        lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) +
                 CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec) * -1000000;
      }
      uVar20 = (ulong)local_1c4;
      uVar23 = *(ulong *)(__ptr[4] + (long)((int)local_1c4 >> 6) * 8);
      iVar5 = *(int *)(__ptr + 1);
      if (0 < (long)iVar5) {
        lVar28 = 0;
        do {
          *(uint *)((long)__ptr + lVar28 * 4 + 0x2030) =
               (uint)((local_1c4 >> ((uint)lVar28 & 0x1f) & 1) != 0);
          lVar28 = lVar28 + 1;
        } while (iVar5 != lVar28);
      }
      sat_solver_setnvars((sat_solver *)__ptr[0x417],
                          *(int *)((long)__ptr + 0xc) * 3 + *(int *)(__ptr + 3));
      iVar5 = *(int *)(__ptr + 1);
      puVar12 = (undefined8 *)(long)iVar5;
      if (iVar5 < *(int *)(__ptr + 2)) {
        uVar6 = iVar5 * 6;
        local_18c = iVar5 * 3;
        local_1ac = (uint)((uVar23 >> (uVar20 & 0x3f) & 1) != 0);
        local_d8 = lVar15;
        do {
          local_160 = (ulong)uVar6;
          uVar27 = *(uint *)(__ptr + 1);
          local_d0 = (ulong)uVar27;
          uVar11 = ((int)puVar12 - uVar27) * 3 + *(int *)(__ptr + 3);
          local_180 = (ulong)uVar11;
          local_1a0 = (undefined8 *)(long)(int)uVar11;
          local_164 = uVar27 * 6;
          iVar5 = uVar6 + *(int *)(__ptr + 3) * 2 + uVar27 * -6;
          local_1d0 = 0;
          local_170 = puVar12;
          do {
            if (0 < *(int *)(__ptr + 2)) {
              lVar15 = local_1d0 + (long)local_1a0;
              puVar18 = (undefined8 *)&DAT_00000004;
              lVar28 = 0;
              do {
                lVar29 = local_1d0 * 0x80 + (long)puVar12 * 0x100;
                if (*(int *)((long)local_198 + lVar28 * 4 + lVar29) != 0) {
                  piVar9 = (int *)((long)local_198 + lVar28 * 4 + lVar29);
                  iVar22 = *(int *)(__ptr + 1);
                  iVar14 = *(int *)(__ptr + 3);
                  local_1b8 = CONCAT44(local_1b8._4_4_,((int)lVar28 - iVar22) * 3 + iVar14);
                  iVar16 = 0;
                  local_1c0 = puVar18;
                  do {
                    iVar7 = *piVar9;
                    if ((iVar7 < 0) || (local_158[0].tv_sec._0_4_ = iVar7 * 2 + 1, lVar15 < 0))
                    goto LAB_005a167c;
                    local_158[0].tv_sec._4_4_ = iVar5 + iVar16;
                    if (lVar28 < *(int *)(__ptr + 1)) {
                      bVar31 = 0x10;
                      end = &local_158[0].tv_nsec;
                      if (iVar16 != *(int *)((long)__ptr + lVar28 * 4 + 0x2030)) goto LAB_005a0c93;
                    }
                    else {
                      if ((int)local_1b8 < -2) goto LAB_005a167c;
                      local_158[0].tv_nsec._0_4_ =
                           iVar16 + (int)puVar18 + iVar14 * 2 + iVar22 * -6 ^ 1;
                      end = (long *)((long)&local_158[0].tv_nsec + 4);
LAB_005a0c93:
                      iVar7 = sat_solver_addclause
                                        ((sat_solver *)__ptr[0x417],(lit *)local_158,(lit *)end);
                      bVar31 = iVar7 == 0;
                    }
                    if ((bVar31 & 0xf) != 0) goto LAB_005a0cc7;
                    iVar16 = iVar16 + 1;
                  } while (iVar16 == 1);
                  bVar31 = 0;
LAB_005a0cc7:
                  puVar18 = local_1c0;
                  if (bVar31 != 0) goto LAB_005a134c;
                }
                lVar28 = lVar28 + 1;
                puVar18 = (undefined8 *)(ulong)((int)puVar18 + 6);
                puVar12 = local_170;
              } while (lVar28 < *(int *)(__ptr + 2));
            }
            iVar5 = iVar5 + 2;
            bVar30 = local_1d0 == 0;
            local_1d0 = local_1d0 + 1;
          } while (bVar30);
          iVar5 = (int)local_180;
          local_1b8 = CONCAT44(local_1b8._4_4_,iVar5 * 2 + 2);
          local_1a0 = (undefined8 *)(ulong)(iVar5 * 2 + 4);
          iVar22 = (int)local_160 - local_164;
          local_1c0 = (undefined8 *)CONCAT44(local_1c0._4_4_,local_18c + (int)local_d0 * -3);
          uVar6 = 0;
          do {
            if ((*(int *)(__ptr + 2) + -1 != (int)puVar12) || (uVar6 != local_1ac)) {
              iVar16 = (int)local_1a0;
              uVar23 = 0;
              iVar14 = iVar22;
              do {
                cVar32 = '\x16';
                uVar27 = (uint)uVar23;
                if (uVar6 != 1 || uVar27 != 0) {
                  if ((int)local_180 < 0) goto LAB_005a167c;
                  local_158[0].tv_sec._0_4_ = uVar27 & 1 | iVar5 * 2;
                  local_158[0].tv_sec._4_4_ = (int)(uVar23 >> 1) + (int)local_1b8;
                  uVar11 = 2;
                  if (*(int *)(__ptr + 2) + -1 != (int)puVar12) {
                    uVar11 = 3;
                    local_158[0].tv_nsec._0_4_ = iVar16 + uVar6 ^ 1;
                  }
                  if (uVar27 != 0) {
                    if ((int)((int)local_1c0 + uVar27) < 0) goto LAB_005a167c;
                    uVar23 = (ulong)uVar11;
                    uVar11 = uVar11 + 1;
                    *(int *)((long)&local_158[0].tv_sec + uVar23 * 4) = iVar14;
                  }
                  iVar7 = sat_solver_addclause
                                    ((sat_solver *)__ptr[0x417],(lit *)local_158,
                                     (lit *)((long)&local_158[0].tv_sec + (ulong)uVar11 * 4));
                  cVar32 = iVar7 == 0;
                }
                if ((cVar32 != '\x16') && (cVar32 != '\0')) goto LAB_005a134c;
                uVar23 = (ulong)(uVar27 + 1);
                iVar14 = iVar14 + 2;
              } while (uVar27 + 1 != 4);
            }
            iVar22 = iVar22 + 1;
            bVar30 = uVar6 == 0;
            uVar6 = uVar6 + 1;
          } while (bVar30);
          puVar12 = (undefined8 *)((long)puVar12 + 1);
          uVar6 = (int)local_160 + 6;
          local_18c = local_18c + 3;
          lVar15 = local_d8;
        } while ((long)puVar12 < (long)*(int *)(__ptr + 2));
      }
      *(int *)(__ptr + 3) = *(int *)(__ptr + 3) + *(int *)((long)__ptr + 0xc) * 3;
      iVar5 = sat_solver_solve((sat_solver *)__ptr[0x417],(lit *)0x0,(lit *)0x0,0,0,0,0);
      if (local_178->fVerbose != 0) {
        printf("Iter %3d : ",(ulong)local_188 & 0xffffffff);
        Extra_PrintBinary(_stdout,&local_1c4,*(int *)(__ptr + 1));
        printf("  Var =%5d  ",(ulong)*(uint *)(__ptr + 3));
        uVar6 = sat_solver_nclauses((sat_solver *)__ptr[0x417]);
        printf("Cla =%6d  ",(ulong)uVar6);
        uVar6 = sat_solver_nconflicts((sat_solver *)__ptr[0x417]);
        printf("Conf =%9d  ",(ulong)uVar6);
        iVar14 = 3;
        iVar22 = clock_gettime(3,local_158);
        if (iVar22 < 0) {
          lVar28 = -1;
        }
        else {
          lVar28 = CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec) / 1000 +
                   CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec) * 1000000;
        }
        Abc_Print(iVar14,"%s =","Time");
        Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar28 + lVar15) / 1000000.0);
      }
      if (iVar5 == -1) {
        puts("The problem has no solution.");
        break;
      }
      iVar5 = *(int *)(__ptr + 1);
      uVar20 = (ulong)iVar5;
      uVar6 = *(uint *)(__ptr + 2);
      uVar23 = (long)(int)uVar6;
      if (iVar5 < (int)uVar6) {
        puVar12 = local_198 + uVar20 * 0x20;
        local_1b8 = (long)(int)uVar6;
        do {
          puVar18 = puVar12;
          lVar15 = 0;
          do {
            iVar14 = 0;
            bVar30 = false;
            uVar23 = 0xffffffff;
            iVar22 = -1;
            local_1c0 = puVar12;
            if (0 < (int)uVar6) {
              uVar24 = 0;
              do {
                uVar27 = *(uint *)((long)puVar18 + uVar24 * 4);
                if ((ulong)uVar27 != 0) {
                  if (((int)uVar27 < 0) || (*(int *)__ptr[0x417] <= (int)uVar27)) goto LAB_005a165d;
                  bVar30 = *(int *)(*(long *)((int *)__ptr[0x417] + 0x52) + (ulong)uVar27 * 4) == 1;
                  if (bVar30) {
                    uVar23 = uVar24 & 0xffffffff;
                  }
                  iVar14 = iVar14 + (uint)bVar30;
                }
                iVar22 = (int)uVar23;
                uVar24 = uVar24 + 1;
              } while (uVar6 != uVar24);
              bVar30 = iVar14 == 1;
            }
            if (!bVar30) goto LAB_005a16d9;
            uVar27 = *(uint *)((long)__ptr + 0x14);
            uVar23 = (ulong)uVar27;
            uVar11 = iVar22 * uVar27;
            if ((int)uVar11 < 0) goto LAB_005a16ba;
            iVar22 = *(int *)(__ptr[5] + 4);
            if (iVar22 <= (int)uVar11) goto LAB_005a16ba;
            lVar28 = *(long *)(__ptr[5] + 8);
            (&local_158[0].tv_sec)[lVar15] = lVar28 + (ulong)uVar11 * 8;
            puVar18 = puVar18 + 0x10;
            bVar30 = lVar15 == 0;
            lVar15 = lVar15 + 1;
          } while (bVar30);
          iVar14 = (int)uVar20;
          uVar11 = uVar27 * iVar14;
          if (((int)uVar11 < 0) || (iVar22 <= (int)uVar11)) goto LAB_005a16ba;
          if (0 < (int)uVar27) {
            memset((void *)(lVar28 + (ulong)uVar11 * 8),0,uVar23 * 8);
          }
          piVar9 = (int *)__ptr[0x417];
          uVar11 = (int)local_1b8 * uVar27;
          lVar15 = lVar28 + (ulong)uVar11 * 8;
          lVar29 = CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec);
          lVar13 = CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec);
          uVar24 = 1;
          do {
            uVar21 = (iVar14 - iVar5) * 3 + (int)uVar24;
            if (((int)uVar21 < 0) || (*piVar9 <= (int)uVar21)) goto LAB_005a165d;
            if (*(int *)(*(long *)(piVar9 + 0x52) + (ulong)uVar21 * 4) != 1) goto LAB_005a1204;
            if (iVar22 <= (int)uVar11 || (int)uVar11 < 0) goto LAB_005a16ba;
            if ((uVar24 & 1) == 0) {
              if (uVar24 < 2) {
                if (0 < (int)uVar27) {
                  uVar26 = 0;
                  do {
                    *(ulong *)(lVar15 + uVar26 * 8) =
                         ~(*(ulong *)(lVar13 + uVar26 * 8) | *(ulong *)(lVar29 + uVar26 * 8));
                    uVar26 = uVar26 + 1;
                  } while (uVar23 != uVar26);
                  goto LAB_005a11ec;
                }
              }
              else if (0 < (int)uVar27) {
                uVar26 = 0;
                do {
                  *(ulong *)(lVar15 + uVar26 * 8) =
                       ~*(ulong *)(lVar29 + uVar26 * 8) & *(ulong *)(lVar13 + uVar26 * 8);
                  uVar26 = uVar26 + 1;
                } while (uVar23 != uVar26);
LAB_005a11ec:
                if (0 < (int)uVar27) {
                  uVar26 = 0;
                  do {
                    puVar1 = (ulong *)(lVar28 + (ulong)(iVar14 * uVar27) * 8 + uVar26 * 8);
                    *puVar1 = *puVar1 | *(ulong *)(lVar15 + uVar26 * 8);
                    uVar26 = uVar26 + 1;
                  } while (uVar23 != uVar26);
                }
              }
            }
            else if (uVar24 < 2) {
              if (0 < (int)uVar27) {
                uVar26 = 0;
                do {
                  *(ulong *)(lVar15 + uVar26 * 8) =
                       ~*(ulong *)(lVar13 + uVar26 * 8) & *(ulong *)(lVar29 + uVar26 * 8);
                  uVar26 = uVar26 + 1;
                } while (uVar23 != uVar26);
                goto LAB_005a11ec;
              }
            }
            else if (0 < (int)uVar27) {
              uVar26 = 0;
              do {
                *(ulong *)(lVar15 + uVar26 * 8) =
                     *(ulong *)(lVar13 + uVar26 * 8) & *(ulong *)(lVar29 + uVar26 * 8);
                uVar26 = uVar26 + 1;
              } while (uVar23 != uVar26);
              goto LAB_005a11ec;
            }
LAB_005a1204:
            uVar24 = uVar24 + 1;
          } while (uVar24 != 4);
          uVar20 = uVar20 + 1;
          puVar12 = local_1c0 + 0x20;
          uVar23 = local_1b8;
        } while (uVar20 != local_1b8);
      }
      uVar6 = ((int)uVar23 + -1) * *(int *)((long)__ptr + 0x14);
      if (((int)uVar6 < 0) || (*(int *)(__ptr[5] + 4) <= (int)uVar6)) {
LAB_005a16ba:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar27 = 1 << ((byte)iVar5 - 6 & 0x1f);
      if (iVar5 < 7) {
        uVar27 = 1;
      }
      uVar11 = 0xffffffff;
      if (0 < (int)uVar27) {
        iVar22 = 0;
        uVar23 = 0;
        do {
          uVar20 = *(ulong *)((ulong)uVar6 * 8 + *(long *)(__ptr[5] + 8) + uVar23 * 8);
          uVar24 = *(ulong *)(__ptr[4] + uVar23 * 8);
          if (uVar20 != uVar24) {
            uVar24 = uVar24 ^ uVar20;
            bVar30 = (int)uVar24 == 0;
            uVar23 = uVar24 >> 0x20;
            if (!bVar30) {
              uVar23 = uVar24;
            }
            iVar16 = (uint)bVar30 * 0x20;
            iVar14 = iVar16 + 0x10;
            uVar20 = uVar23 >> 0x10;
            if ((short)uVar23 != 0) {
              iVar14 = iVar16;
              uVar20 = uVar23;
            }
            iVar16 = iVar14 + 8;
            uVar23 = uVar20 >> 8;
            if ((char)uVar20 != '\0') {
              iVar16 = iVar14;
              uVar23 = uVar20;
            }
            iVar14 = iVar16 + 4;
            uVar20 = uVar23 >> 4;
            if ((uVar23 & 0xf) != 0) {
              iVar14 = iVar16;
              uVar20 = uVar23;
            }
            uVar6 = (uint)(uVar20 >> 2) & 0x3fffffff;
            iVar16 = iVar14 + 2;
            if ((uVar20 & 3) != 0) {
              uVar6 = (uint)uVar20;
              iVar16 = iVar14;
            }
            uVar11 = ((~uVar6 & 1) + iVar16) - iVar22;
            break;
          }
          uVar23 = uVar23 + 1;
          iVar22 = iVar22 + -0x40;
        } while (uVar27 != uVar23);
      }
      if (1 << ((byte)iVar5 & 0x1f) <= (int)uVar11) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                      ,0x29a,"int Exa_ManEval(Exa_Man_t *)");
      }
      local_188 = (undefined8 *)CONCAT44(local_188._4_4_,(int)local_188 + 1);
      local_1c4 = uVar11;
    } while (uVar11 != 0xffffffff);
  }
LAB_005a134c:
  if (local_1c4 == 0xffffffff) {
    printf("Realization of given %d-input function using %d two-input gates:\n",
           (ulong)*(uint *)(__ptr + 1),(ulong)*(uint *)((long)__ptr + 0xc));
    iVar5 = *(int *)(__ptr + 2);
    uVar23 = (ulong)*(uint *)(__ptr + 1);
    if ((int)*(uint *)(__ptr + 1) < iVar5) {
      puVar12 = __ptr + (long)iVar5 * 0x20 + -10;
      uVar20 = (long)iVar5;
      do {
        uVar24 = uVar20 - 1;
        iVar5 = (int)uVar24 - (int)uVar23;
        if (iVar5 < 0) {
LAB_005a165d:
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        uVar6 = iVar5 * 3 + 1;
        iVar22 = *(int *)__ptr[0x417];
        if (iVar22 <= (int)uVar6) goto LAB_005a165d;
        lVar15 = *(long *)((int *)__ptr[0x417] + 0x52);
        bVar30 = *(int *)(lVar15 + (ulong)uVar6 * 4) == 1;
        uVar6 = iVar5 * 3 + 2;
        if (iVar22 <= (int)uVar6) goto LAB_005a165d;
        uVar27 = iVar5 * 3 + 3;
        if (iVar22 <= (int)uVar27) goto LAB_005a165d;
        uVar23 = (ulong)bVar30;
        uVar6 = (uint)(*(int *)(lVar15 + (ulong)uVar6 * 4) == 1);
        uVar27 = (uint)(*(int *)(lVar15 + (ulong)uVar27 * 4) == 1);
        if (((local_c0 & 1) == 0) || (*(int *)(__ptr + 2) != (int)uVar20)) {
          pcVar19 = "%02d = 4\'b%d%d%d0(";
        }
        else {
          uVar27 = uVar27 ^ 1;
          uVar6 = uVar6 ^ 1;
          uVar23 = (ulong)(bVar30 ^ 1);
          pcVar19 = "%02d = 4\'b%d%d%d1(";
        }
        printf(pcVar19,uVar24 & 0xffffffff,(ulong)uVar27,(ulong)uVar6,uVar23);
        lVar15 = 1;
        puVar18 = puVar12;
        do {
          iVar5 = 0;
          bVar30 = false;
          uVar23 = 0xffffffff;
          if (0 < (long)*(int *)(__ptr + 2)) {
            uVar20 = 0;
            do {
              uVar6 = *(uint *)((long)puVar18 + uVar20 * 4);
              if ((ulong)uVar6 != 0) {
                if (((int)uVar6 < 0) || (*(int *)__ptr[0x417] <= (int)uVar6)) goto LAB_005a165d;
                bVar30 = *(int *)(*(long *)((int *)__ptr[0x417] + 0x52) + (ulong)uVar6 * 4) == 1;
                if (bVar30) {
                  uVar23 = uVar20 & 0xffffffff;
                }
                iVar5 = iVar5 + (uint)bVar30;
              }
              uVar20 = uVar20 + 1;
            } while ((long)*(int *)(__ptr + 2) != uVar20);
            bVar30 = iVar5 == 1;
          }
          if (!bVar30) {
LAB_005a16d9:
            __assert_fail("Count == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                          ,0x280,"int Exa_ManFindFanin(Exa_Man_t *, int, int)");
          }
          iVar5 = (int)uVar23;
          if ((iVar5 < 0) || (*(int *)(__ptr + 1) <= iVar5)) {
            pcVar19 = " %02d";
          }
          else {
            uVar23 = (ulong)(iVar5 + 0x61);
            pcVar19 = " %c";
          }
          printf(pcVar19,uVar23);
          puVar18 = puVar18 + -0x10;
          bVar30 = lVar15 != 0;
          lVar15 = lVar15 + -1;
        } while (bVar30);
        puts(" )");
        uVar23 = (ulong)*(int *)(__ptr + 1);
        puVar12 = puVar12 + -0x20;
        uVar20 = uVar24;
      } while ((long)uVar23 < (long)uVar24);
    }
  }
  sat_solver_delete((sat_solver *)__ptr[0x417]);
  pvVar10 = (void *)__ptr[5];
  if (*(void **)((long)pvVar10 + 8) != (void *)0x0) {
    free(*(void **)((long)pvVar10 + 8));
    *(undefined8 *)((long)pvVar10 + 8) = 0;
  }
  lVar15 = local_c8;
  if (pvVar10 != (void *)0x0) {
    free(pvVar10);
  }
  piVar9 = (int *)__ptr[0x416];
  if (0 < *piVar9) {
    lVar28 = 8;
    lVar29 = 0;
    do {
      if (*(void **)(*(long *)(piVar9 + 2) + lVar28) != (void *)0x0) {
        free(*(void **)(*(long *)(piVar9 + 2) + lVar28));
        *(undefined8 *)(*(long *)(piVar9 + 2) + lVar28) = 0;
      }
      lVar29 = lVar29 + 1;
      lVar28 = lVar28 + 0x10;
    } while (lVar29 < *piVar9);
  }
  if (*(void **)(piVar9 + 2) != (void *)0x0) {
    free(*(void **)(piVar9 + 2));
    piVar9[2] = 0;
    piVar9[3] = 0;
  }
  piVar9[0] = 0;
  piVar9[1] = 0;
  free(piVar9);
  free(__ptr);
  iVar22 = 3;
  iVar5 = clock_gettime(3,local_158);
  if (iVar5 < 0) {
    lVar28 = -1;
  }
  else {
    lVar28 = CONCAT44(local_158[0].tv_nsec._4_4_,(uint)local_158[0].tv_nsec) / 1000 +
             CONCAT44(local_158[0].tv_sec._4_4_,(uint)local_158[0].tv_sec) * 1000000;
  }
  Abc_Print(iVar22,"%s =","Total runtime");
  Abc_Print(iVar22,"%9.2f sec\n",(double)(lVar28 + lVar15) / 1000000.0);
  return;
LAB_005a07e5:
  bVar30 = false;
  iVar22 = 1;
LAB_005a07f3:
  if (iVar22 != 0) {
    if (iVar22 != 5) {
      if (!bVar30) goto LAB_005a16f8;
      goto LAB_005a09be;
    }
    goto LAB_005a08df;
  }
  puVar18 = puVar18 + 0x10;
  bVar30 = puVar25 != (undefined8 *)0x0;
  puVar25 = (undefined8 *)((long)puVar25 + 1);
  if (bVar30) goto LAB_005a08df;
  goto LAB_005a06c1;
LAB_005a08df:
  iVar5 = (int)local_180;
  if (iVar5 < 0) {
LAB_005a167c:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar6 = iVar5 * 6 + 2;
  uVar27 = iVar5 * 6 + 6;
  iVar22 = 3;
  do {
    local_158[0].tv_sec._0_4_ = iVar22 == 2 | uVar6;
    local_158[0].tv_sec._4_4_ = (uint)(iVar22 == 1) | iVar5 * 6 + 4U;
    local_158[0].tv_nsec._0_4_ = iVar22 != 3 | uVar27;
    iVar14 = sat_solver_addclause
                       ((sat_solver *)__ptr[0x417],(lit *)local_158,
                        (lit *)((long)&local_158[0].tv_nsec + 4));
    if (iVar14 == 0) goto LAB_005a16f8;
    iVar22 = iVar22 + -1;
  } while (iVar22 != 0);
  if (local_1ac != 0) {
    local_158[0].tv_sec._0_4_ = uVar6 | 1;
    local_158[0].tv_sec._4_4_ = iVar5 * 6 + 5;
    local_158[0].tv_nsec._0_4_ = uVar27;
    iVar5 = sat_solver_addclause
                      ((sat_solver *)__ptr[0x417],(lit *)local_158,
                       (lit *)((long)&local_158[0].tv_nsec + 4));
    if (iVar5 == 0) goto LAB_005a16f8;
  }
LAB_005a09be:
  puVar12 = (undefined8 *)((long)local_198 + 1);
  puVar18 = local_170 + 0x20;
  local_1a0 = local_1a0 + 0x20;
  if ((long)*(int *)(__ptr + 2) <= (long)puVar12) goto LAB_005a09e5;
  goto LAB_005a0699;
}

Assistant:

void Exa_ManExactSynthesis2( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    p = Exa_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d two-input gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Exa_ManAddCnf( p, iMint ) )
            break;
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( pPars->fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Exa_ManEval( p );
    }
    if ( iMint == -1 )
        Exa_ManPrintSolution( p, fCompl );
    Exa_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}